

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplicationstatic.h
# Opt level: O3

void QtGlobalStatic::
     ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>
     ::reset(void)

{
  QBasicMutex QVar1;
  
  if ((AtomicType)mutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    mutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
  }
  else {
    QBasicMutex::lockInternal();
  }
  QHostInfoLookupManager::~QHostInfoLookupManager((QHostInfoLookupManager *)&storage);
  QVar1 = mutex;
  guard._q_value.super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0x0;
  LOCK();
  mutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
  UNLOCK();
  if ((AtomicType)QVar1.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
    QBasicMutex::unlockInternalFutex(&mutex);
    return;
  }
  return;
}

Assistant:

static void reset()
    {
        // we only synchronize using the mutex here, not the guard
        QMutexLocker locker(&mutex);
        realPointer()->~PlainType();
        guard.storeRelaxed(QtGlobalStatic::Uninitialized);
    }